

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O0

ArgOption<unsigned_int> * __thiscall
Utils::ArgumentParser::make_option<unsigned_int>
          (ArgumentParser *this,string *name,string *description,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *opts)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  ArgOption<unsigned_int> *this_01;
  reference pbVar2;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgOption<unsigned_int>_*>
  local_e8;
  _Base_ptr local_c0;
  undefined1 local_b8;
  _Self local_b0;
  _Self local_a8;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  ArgOption<unsigned_int> *local_50;
  ArgOption<unsigned_int> *o;
  undefined1 local_40;
  _Self local_38;
  _Self local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *opts_local;
  string *description_local;
  string *name_local;
  ArgumentParser *this_local;
  
  local_28 = opts;
  opts_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)description;
  description_local = name;
  name_local = (string *)this;
  local_30._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&this->used_name,name);
  local_38._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->used_name);
  bVar1 = std::operator==(&local_30,&local_38);
  if (!bVar1) {
    __assert_fail("used_name.find(name) == used_name.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/ArgumentParser.hpp"
                  ,0x105,
                  "ArgOption<T> &Utils::ArgumentParser::make_option(const std::string &, const std::string &, const std::vector<std::string> &) [T = unsigned int]"
                 );
  }
  pVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->used_name,description_local);
  o = (ArgOption<unsigned_int> *)pVar3.first._M_node;
  local_40 = pVar3.second;
  this_01 = (ArgOption<unsigned_int> *)operator_new(0x68);
  ArgOption<unsigned_int>::ArgOption(this_01,description_local,(string *)opts_local,local_28);
  __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_01;
  local_50 = this_01;
  std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::push_back
            (&this->options,(value_type *)&__range2);
  this_00 = local_28;
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(local_28);
  i.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&i.field_2 + 8));
    if (!bVar1) {
      return local_50;
    }
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
    std::__cxx11::string::string((string *)local_a0,(string *)pbVar2);
    local_a8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&this->used_identifier,(key_type *)local_a0);
    local_b0._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->used_identifier);
    bVar1 = std::operator==(&local_a8,&local_b0);
    if (!bVar1) break;
    pVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->used_identifier,(value_type *)local_a0);
    local_c0 = (_Base_ptr)pVar3.first._M_node;
    local_b8 = pVar3.second;
    std::make_pair<std::__cxx11::string&,Utils::ArgOption<unsigned_int>*&>
              (&local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
               &local_50);
    std::
    map<std::__cxx11::string,Utils::ValueArgObj*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Utils::ValueArgObj*>>>
    ::insert<std::pair<std::__cxx11::string,Utils::ArgOption<unsigned_int>*>>
              ((map<std::__cxx11::string,Utils::ValueArgObj*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Utils::ValueArgObj*>>>
                *)&this->option_mapping,&local_e8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgOption<unsigned_int>_*>
    ::~pair(&local_e8);
    std::__cxx11::string::~string((string *)local_a0);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  __assert_fail("used_identifier.find(i) == used_identifier.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/ArgumentParser.hpp"
                ,0x10c,
                "ArgOption<T> &Utils::ArgumentParser::make_option(const std::string &, const std::string &, const std::vector<std::string> &) [T = unsigned int]"
               );
}

Assistant:

ArgOption<T>& ArgumentParser::make_option( const std::string& name,
        const std::string& description, const std::vector<std::string>& opts) {
    assert(used_name.find(name) == used_name.end());
    used_name.insert(name);

    auto o = new ArgOption<T>(name,description,opts);
    options.push_back(o);

    for ( auto i : opts ) {
        assert(used_identifier.find(i) == used_identifier.end());
        used_identifier.insert(i);

        option_mapping.insert( make_pair (i, o));
    }

    return *o;
}